

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall GlobOptBlockData::CopyBlockData(GlobOptBlockData *this,GlobOptBlockData *fromData)

{
  this->globOpt = fromData->globOpt;
  this->symToValueMap = fromData->symToValueMap;
  this->exprToValueMap = fromData->exprToValueMap;
  this->liveFields = fromData->liveFields;
  this->liveArrayValues = fromData->liveArrayValues;
  this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
  this->isTempSrc = fromData->isTempSrc;
  this->liveVarSyms = fromData->liveVarSyms;
  this->liveInt32Syms = fromData->liveInt32Syms;
  this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
  this->liveFloat64Syms = fromData->liveFloat64Syms;
  this->argObjSyms = fromData->argObjSyms;
  this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
  this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
  this->curFunc = fromData->curFunc;
  this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
  this->inductionVariables = fromData->inductionVariables;
  this->availableIntBoundChecks = fromData->availableIntBoundChecks;
  this->callSequence = fromData->callSequence;
  this->startCallCount = fromData->startCallCount;
  this->argOutCount = fromData->argOutCount;
  this->totalOutParamCount = fromData->totalOutParamCount;
  this->inlinedArgOutSize = fromData->inlinedArgOutSize;
  this->hasCSECandidates = fromData->hasCSECandidates;
  this->changedSyms = fromData->changedSyms;
  this->capturedValues = fromData->capturedValues;
  this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;
  this->hasDataRef = fromData->hasDataRef;
  return;
}

Assistant:

void
GlobOptBlockData::CopyBlockData(GlobOptBlockData *fromData)
{
    this->globOpt = fromData->globOpt;

    this->symToValueMap = fromData->symToValueMap;
    this->exprToValueMap = fromData->exprToValueMap;
    this->liveFields = fromData->liveFields;
    this->liveArrayValues = fromData->liveArrayValues;
    this->maybeWrittenTypeSyms = fromData->maybeWrittenTypeSyms;
    this->isTempSrc = fromData->isTempSrc;
    this->liveVarSyms = fromData->liveVarSyms;
    this->liveInt32Syms = fromData->liveInt32Syms;
    this->liveLossyInt32Syms = fromData->liveLossyInt32Syms;
    this->liveFloat64Syms = fromData->liveFloat64Syms;
    this->argObjSyms = fromData->argObjSyms;
    this->maybeTempObjectSyms = fromData->maybeTempObjectSyms;
    this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms;
    this->curFunc = fromData->curFunc;
    this->valuesToKillOnCalls = fromData->valuesToKillOnCalls;
    this->inductionVariables = fromData->inductionVariables;
    this->availableIntBoundChecks = fromData->availableIntBoundChecks;
    this->callSequence = fromData->callSequence;
    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    this->changedSyms = fromData->changedSyms;
    this->capturedValues = fromData->capturedValues;

    this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap;
    this->OnDataReused(fromData);
}